

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O1

int Kit_GraphToGiaInternal(Gia_Man_t *pMan,Kit_Graph_t *pGraph,int fHash)

{
  Kit_Edge_t KVar1;
  Kit_Node_t *pKVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  Gia_Obj_t *pGVar7;
  uint *puVar8;
  int *piVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  uint iLit1;
  uint iLit0;
  uint uVar18;
  int iVar19;
  
  KVar1 = pGraph->eRoot;
  if (pGraph->fConst == 0) {
    uVar4 = (uint)KVar1 >> 1 & 0x3fffffff;
    lVar16 = (long)pGraph->nLeaves;
    if (uVar4 < (uint)pGraph->nLeaves) {
      uVar4 = pGraph->pNodes[uVar4].field_2.iFunc;
      if ((int)uVar4 < 0) {
LAB_005d00ea:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar4 = uVar4 ^ (uint)KVar1 & 1;
    }
    else {
      lVar6 = lVar16 * 0x18 + 8;
      do {
        lVar14 = lVar6;
        pKVar2 = pGraph->pNodes;
        uVar4 = *(uint *)((long)pKVar2 + lVar14 + -8);
        uVar15 = pKVar2[uVar4 >> 1 & 0x3fffffff].field_2.iFunc;
        if ((int)uVar15 < 0) goto LAB_005d00ea;
        uVar11 = *(uint *)((long)pKVar2 + lVar14 + -4);
        uVar18 = pKVar2[uVar11 >> 1 & 0x3fffffff].field_2.iFunc;
        if ((int)uVar18 < 0) goto LAB_005d00ea;
        uVar4 = uVar4 & 1;
        iLit0 = uVar4 ^ uVar15;
        uVar11 = uVar11 & 1;
        iLit1 = uVar11 ^ uVar18;
        if (fHash == 0) {
          if (pMan->fGiaSimple == 0) {
            uVar5 = iLit1;
            if ((int)iLit0 < 2) {
              if (uVar4 == uVar15) {
                uVar5 = 0;
              }
            }
            else if ((int)iLit1 < 2) {
              uVar5 = iLit0;
              if (uVar11 == uVar18) {
                uVar5 = 0;
              }
            }
            else if ((iLit0 != iLit1) && (uVar5 = 0, (iLit1 ^ iLit0) != 1)) goto LAB_005cfb83;
          }
          else {
LAB_005cfb83:
            uVar4 = pMan->nObjs;
            uVar11 = pMan->nObjsAlloc;
            if (uVar4 == uVar11) {
              uVar5 = uVar11 * 2;
              if (0x1fffffff < (int)(uVar11 * 2)) {
                uVar5 = 0x20000000;
              }
              if (uVar4 == 0x20000000) {
                puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
                exit(1);
              }
              if ((int)uVar5 <= (int)uVar4) {
                __assert_fail("p->nObjs < nObjNew",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x288,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
              }
              if (pMan->fVerbose != 0) {
                printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar11,(ulong)uVar5);
              }
              if (pMan->nObjsAlloc < 1) {
                __assert_fail("p->nObjsAlloc > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x28b,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
              }
              lVar6 = (long)(int)uVar5;
              if (pMan->pObjs == (Gia_Obj_t *)0x0) {
                pGVar7 = (Gia_Obj_t *)malloc(lVar6 * 0xc);
              }
              else {
                pGVar7 = (Gia_Obj_t *)realloc(pMan->pObjs,lVar6 * 0xc);
              }
              pMan->pObjs = pGVar7;
              memset(pGVar7 + pMan->nObjsAlloc,0,(lVar6 - pMan->nObjsAlloc) * 0xc);
              if (pMan->pMuxes != (uint *)0x0) {
                puVar8 = (uint *)realloc(pMan->pMuxes,lVar6 * 4);
                pMan->pMuxes = puVar8;
                memset(puVar8 + pMan->nObjsAlloc,0,(lVar6 - pMan->nObjsAlloc) * 4);
              }
              pMan->nObjsAlloc = uVar5;
            }
            if ((pMan->vHTable).nSize != 0) {
              uVar4 = (pMan->vHash).nCap;
              if ((pMan->vHash).nSize == uVar4) {
                if ((int)uVar4 < 0x10) {
                  piVar9 = (pMan->vHash).pArray;
                  if (piVar9 == (int *)0x0) {
                    piVar9 = (int *)malloc(0x40);
                  }
                  else {
                    piVar9 = (int *)realloc(piVar9,0x40);
                  }
                  (pMan->vHash).pArray = piVar9;
                  iVar19 = 0x10;
                }
                else {
                  iVar19 = uVar4 * 2;
                  if (iVar19 <= (int)uVar4) goto LAB_005cfd5f;
                  piVar9 = (pMan->vHash).pArray;
                  if (piVar9 == (int *)0x0) {
                    piVar9 = (int *)malloc((ulong)uVar4 << 3);
                  }
                  else {
                    piVar9 = (int *)realloc(piVar9,(ulong)uVar4 << 3);
                  }
                  (pMan->vHash).pArray = piVar9;
                }
                if (piVar9 == (int *)0x0) {
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                (pMan->vHash).nCap = iVar19;
              }
LAB_005cfd5f:
              iVar19 = (pMan->vHash).nSize;
              (pMan->vHash).nSize = iVar19 + 1;
              (pMan->vHash).pArray[iVar19] = 0;
            }
            iVar19 = pMan->nObjs;
            pMan->nObjs = iVar19 + 1;
            if ((long)iVar19 < 0) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar15 = uVar15 >> 1;
            if (iVar19 < (int)uVar15) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            uVar18 = uVar18 >> 1;
            if (iVar19 < (int)uVar18) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            pGVar7 = pMan->pObjs + iVar19;
            if ((uVar15 == uVar18) && (pMan->fGiaSimple == 0)) {
              __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            uVar4 = iVar19 - uVar15 & 0x1fffffff;
            uVar10 = *(ulong *)pGVar7;
            if ((int)iLit0 < (int)iLit1) {
              uVar13 = (ulong)(uVar4 | (iLit0 & 1) << 0x1d);
              *(ulong *)pGVar7 = uVar13 | uVar10 & 0xffffffffc0000000;
              pGVar3 = pMan->pObjs;
              if ((pGVar7 < pGVar3) || (pGVar3 + pMan->nObjs <= pGVar7)) goto LAB_005d0109;
              uVar12 = (ulong)(((uint)((int)pGVar7 - (int)pGVar3) >> 2) * -0x55555555 - uVar18 &
                              0x1fffffff) << 0x20;
              *(ulong *)pGVar7 = uVar13 | uVar10 & 0xe0000000c0000000 | uVar12;
              uVar10 = uVar13 | uVar10 & 0xc0000000c0000000 | uVar12 | (ulong)(iLit1 & 1) << 0x3d;
            }
            else {
              uVar13 = (ulong)uVar4 << 0x20;
              uVar12 = (ulong)(iLit0 & 1) << 0x3d;
              *(ulong *)pGVar7 = uVar12 | uVar10 & 0xc0000000ffffffff | uVar13;
              pGVar3 = pMan->pObjs;
              if ((pGVar7 < pGVar3) || (pGVar3 + pMan->nObjs <= pGVar7)) goto LAB_005d0109;
              uVar17 = (ulong)(((uint)((int)pGVar7 - (int)pGVar3) >> 2) * -0x55555555 - uVar18 &
                              0x1fffffff);
              *(ulong *)pGVar7 = uVar12 | uVar10 & 0xc0000000e0000000 | uVar13 | uVar17;
              uVar10 = uVar12 | uVar10 & 0xc0000000c0000000 | uVar13 | uVar17 |
                       (ulong)((iLit1 & 1) << 0x1d);
            }
            *(ulong *)pGVar7 = uVar10;
            if (pMan->pFanData != (int *)0x0) {
              Gia_ObjAddFanout(pMan,pGVar7 + -(uVar10 & 0x1fffffff),pGVar7);
              Gia_ObjAddFanout(pMan,pGVar7 + -((ulong)*(uint *)&pGVar7->field_0x4 & 0x1fffffff),
                               pGVar7);
            }
            if (pMan->fSweeper != 0) {
              uVar13 = *(ulong *)pGVar7 & 0x1fffffff;
              uVar10 = *(ulong *)pGVar7 >> 0x20 & 0x1fffffff;
              uVar12 = 0x4000000000000000;
              if (((uint)*(ulong *)(pGVar7 + -uVar13) >> 0x1e & 1) == 0) {
                uVar12 = 0x40000000;
              }
              *(ulong *)(pGVar7 + -uVar13) = uVar12 | *(ulong *)(pGVar7 + -uVar13);
              uVar12 = *(ulong *)(pGVar7 + -uVar10);
              uVar17 = 0x4000000000000000;
              if (((uint)uVar12 >> 0x1e & 1) == 0) {
                uVar17 = 0x40000000;
              }
              *(ulong *)(pGVar7 + -uVar10) = uVar17 | uVar12;
              uVar10 = *(ulong *)pGVar7;
              *(ulong *)pGVar7 =
                   uVar10 & 0x7fffffffffffffff |
                   (ulong)(((uint)(uVar10 >> 0x3d) ^ (uint)(uVar12 >> 0x3f)) &
                          ((uint)((ulong)*(undefined8 *)(pGVar7 + -uVar13) >> 0x3f) ^
                          (uint)(uVar10 >> 0x1d) & 7)) << 0x3f;
            }
            if (pMan->fBuiltInSim != 0) {
              uVar10 = *(ulong *)pGVar7;
              *(ulong *)pGVar7 =
                   uVar10 & 0x7fffffffffffffff |
                   (ulong)(((uint)(uVar10 >> 0x3d) ^
                           (uint)((ulong)*(undefined8 *)(pGVar7 + -(uVar10 >> 0x20 & 0x1fffffff)) >>
                                 0x3f)) &
                          ((uint)((ulong)*(undefined8 *)(pGVar7 + -(uVar10 & 0x1fffffff)) >> 0x3f) ^
                          (uint)(uVar10 >> 0x1d) & 7)) << 0x3f;
              pGVar3 = pMan->pObjs;
              if ((pGVar7 < pGVar3) || (pGVar3 + pMan->nObjs <= pGVar7)) goto LAB_005d0109;
              Gia_ManBuiltInSimPerform
                        (pMan,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
            }
            if (pMan->vSuppWords != (Vec_Wrd_t *)0x0) {
              Gia_ManQuantSetSuppAnd(pMan,pGVar7);
            }
            pGVar3 = pMan->pObjs;
            if ((pGVar7 < pGVar3) || (pGVar3 + pMan->nObjs <= pGVar7)) {
LAB_005d0109:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar5 = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * 0x55555556;
          }
        }
        else {
          uVar5 = Gia_ManHashAnd(pMan,iLit0,iLit1);
        }
        *(uint *)(&(pKVar2->eEdge0).field_0x0 + lVar14) = uVar5;
        lVar16 = lVar16 + 1;
        lVar6 = lVar14 + 0x18;
      } while (lVar16 < pGraph->nSize);
      uVar4 = *(uint *)(&(pKVar2->eEdge0).field_0x0 + lVar14);
      if ((int)uVar4 < 0) goto LAB_005d00ea;
      uVar4 = (uint)pGraph->eRoot & 1 ^ uVar4;
    }
  }
  else {
    uVar4 = ~(uint)KVar1 & 1;
  }
  return uVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Kit_GraphToGiaInternal( Gia_Man_t * pMan, Kit_Graph_t * pGraph, int fHash )
{
    Kit_Node_t * pNode = NULL;
    int i, pAnd0, pAnd1;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Abc_LitNotCond( 1, Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Abc_LitNotCond( Kit_GraphVar(pGraph)->iFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Abc_LitNotCond( Kit_GraphNode(pGraph, pNode->eEdge0.Node)->iFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Abc_LitNotCond( Kit_GraphNode(pGraph, pNode->eEdge1.Node)->iFunc, pNode->eEdge1.fCompl ); 
        if ( fHash )
            pNode->iFunc = Gia_ManHashAnd( pMan, pAnd0, pAnd1 );
        else
            pNode->iFunc = Gia_ManAppendAnd2( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Abc_LitNotCond( pNode->iFunc, Kit_GraphIsComplement(pGraph) );
}